

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnBrTableExpr
          (ExprVisitorDelegate *this,BrTableExpr *expr)

{
  WatWriter *this_00;
  pointer pVVar1;
  char *s;
  Var *var;
  pointer var_00;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::BrTable_Opcode);
  WritePutsSpace(this_00,s);
  pVVar1 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (var_00 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
                super__Vector_impl_data._M_start; var_00 != pVVar1; var_00 = var_00 + 1) {
    WriteBrVar(this->writer_,var_00,Space);
  }
  WriteBrVar(this->writer_,&expr->default_target,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnBrTableExpr(BrTableExpr* expr) {
  writer_->WritePutsSpace(Opcode::BrTable_Opcode.GetName());
  for (const Var& var : expr->targets) {
    writer_->WriteBrVar(var, NextChar::Space);
  }
  writer_->WriteBrVar(expr->default_target, NextChar::Newline);
  return Result::Ok;
}